

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Index * sqlite3FindIndex(sqlite3 *db,char *zName,char *zDb)

{
  int iVar1;
  long in_RDX;
  long in_RDI;
  Schema *pSchema;
  int j;
  int i;
  Index *p;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  Hash *pH;
  uint iDb;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)0x0;
  iDb = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x28) <= (int)iDb) {
      return (Index *)db_00;
    }
    uVar2 = iDb;
    if ((int)iDb < 2) {
      uVar2 = iDb ^ 1;
    }
    pH = *(Hash **)(*(long *)(in_RDI + 0x20) + (long)(int)uVar2 * 0x20 + 0x18);
    if (((in_RDX == 0) || (iVar1 = sqlite3DbIsNamed(db_00,iDb,(char *)pH), iVar1 != 0)) &&
       (db_00 = (sqlite3 *)sqlite3HashFind(pH,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffc8)),
       db_00 != (sqlite3 *)0x0)) break;
    iDb = iDb + 1;
  }
  return (Index *)db_00;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3FindIndex(sqlite3 *db, const char *zName, const char *zDb){
  Index *p = 0;
  int i;
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    Schema *pSchema = db->aDb[j].pSchema;
    assert( pSchema );
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&pSchema->idxHash, zName);
    if( p ) break;
  }
  return p;
}